

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::empty
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  uint8_t uVar2;
  short_string_storage *this_00;
  size_t sVar3;
  array_storage *this_01;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this_02;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  object_storage *in_stack_ffffffffffffffc0;
  bool local_1;
  
  jVar1 = storage_kind(in_RDI);
  this_02 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
            (ulong)(byte)(jVar1 - empty_object);
  switch(this_02) {
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x0:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x3:
    this_00 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                        (in_stack_ffffffffffffff80);
    uVar2 = short_string_storage::length(this_00);
    local_1 = uVar2 == '\0';
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x4:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffff80);
    json_const_reference_storage::value((json_const_reference_storage *)0x1f2780);
    local_1 = empty(this_02);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x5:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff80);
    json_reference_storage::value((json_reference_storage *)0x1f27ae);
    local_1 = empty(this_02);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x8:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
              (in_stack_ffffffffffffff80);
    sVar3 = byte_string_storage::length((byte_string_storage *)0x1f264d);
    local_1 = sVar3 == 0;
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x9:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
              (in_stack_ffffffffffffff80);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
    value_abi_cxx11_(in_stack_ffffffffffffffc0);
    local_1 = order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
              ::empty((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                       *)0x1f2750);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0xa:
    this_01 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                        (in_stack_ffffffffffffff80);
    array_storage::value(this_01);
    local_1 = json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
              ::empty((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                       *)0x1f26ff);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0xb:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
              (in_stack_ffffffffffffff80);
    sVar3 = long_string_storage::length((long_string_storage *)0x1f26bb);
    local_1 = sVar3 == 0;
  }
  return local_1;
}

Assistant:

bool empty() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                    return cast<byte_string_storage>().length() == 0;
                    break;
                case json_storage_kind::short_str:
                    return cast<short_string_storage>().length() == 0;
                case json_storage_kind::long_str:
                    return cast<long_string_storage>().length() == 0;
                case json_storage_kind::array:
                    return cast<array_storage>().value().empty();
                case json_storage_kind::empty_object:
                    return true;
                case json_storage_kind::object:
                    return cast<object_storage>().value().empty();
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().empty();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().empty();
                default:
                    return false;
            }
        }